

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O0

void I_ClosestResolution(int *width,int *height,int bits)

{
  IVideo *pIVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  byte local_49;
  uint local_34;
  DWORD dist;
  DWORD closest;
  int iteration;
  int cheight;
  int cwidth;
  int theight;
  int twidth;
  int bits_local;
  int *height_local;
  int *width_local;
  
  iteration = 0;
  closest = 0;
  local_34 = 0xffffffff;
  dist = 0;
  theight = bits;
  _twidth = (DWORD *)height;
  height_local = width;
  do {
    iVar2 = theight;
    pIVar1 = Video;
    if (1 < (int)dist) {
      return;
    }
    if (screen == (DFrameBuffer *)0x0) {
      local_49 = FBoolCVar::operator_cast_to_bool(&fullscreen);
    }
    else {
      iVar3 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      local_49 = (byte)iVar3;
    }
    (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)(uint)iVar2,(ulong)(local_49 & 1));
    while (uVar4 = (*Video->_vptr_IVideo[6])(Video,&cwidth,&cheight,0), (uVar4 & 1) != 0) {
      if ((cwidth == *height_local) && (cheight == *_twidth)) {
        return;
      }
      if (((dist != 0) || ((*height_local <= cwidth && ((int)*_twidth <= cheight)))) &&
         (uVar4 = (cwidth - *height_local) * (cwidth - *height_local) +
                  (cheight - *_twidth) * (cheight - *_twidth), uVar4 < local_34)) {
        iteration = cwidth;
        closest = cheight;
        local_34 = uVar4;
      }
    }
    if (local_34 != 0xffffffff) {
      *height_local = iteration;
      *_twidth = closest;
      return;
    }
    dist = dist + 1;
  } while( true );
}

Assistant:

void I_ClosestResolution (int *width, int *height, int bits)
{
	int twidth, theight;
	int cwidth = 0, cheight = 0;
	int iteration;
	DWORD closest = 4294967295u;

	for (iteration = 0; iteration < 2; iteration++)
	{
		Video->StartModeIterator (bits, screen ? screen->IsFullscreen() : fullscreen);
		while (Video->NextMode (&twidth, &theight, NULL))
		{
			if (twidth == *width && theight == *height)
				return;

			if (iteration == 0 && (twidth < *width || theight < *height))
				continue;

			DWORD dist = (twidth - *width) * (twidth - *width)
				+ (theight - *height) * (theight - *height);

			if (dist < closest)
			{
				closest = dist;
				cwidth = twidth;
				cheight = theight;
			}
		}
		if (closest != 4294967295u)
		{
			*width = cwidth;
			*height = cheight;
			return;
		}
	}
}